

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O2

PermissionStatus QPermissions::Private::checkPermission(QPermission *permission)

{
  QDebug *pQVar1;
  long in_FS_OFFSET;
  QMessageLogger local_30;
  
  local_30.context.category = *(char **)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcPermissions();
  if (((byte)QtPrivateLogging::lcPermissions::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    QMessageLogger::debug(&local_30);
    pQVar1 = QDebug::operator<<((QDebug *)&local_30,"No permission backend on this platform.");
    pQVar1 = QDebug::operator<<(pQVar1,"Optimistically returning Granted for");
    local_30.context.file = (char *)pQVar1->stream;
    ((Stream *)local_30.context.file)->ref = ((Stream *)local_30.context.file)->ref + 1;
    ::operator<<((QDebug)&local_30.context.function,(QPermission *)&local_30.context.file);
    QDebug::~QDebug((QDebug *)&local_30.context.function);
    QDebug::~QDebug((QDebug *)&local_30.context.file);
    QDebug::~QDebug((QDebug *)&local_30);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == local_30.context.category) {
    return Granted;
  }
  __stack_chk_fail();
}

Assistant:

Qt::PermissionStatus checkPermission(const QPermission &permission)
    {
        qCDebug(lcPermissions) << "No permission backend on this platform."
            << "Optimistically returning Granted for" << permission;
        return Qt::PermissionStatus::Granted;
    }